

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeR.cpp
# Opt level: O0

void __thiscall OpenMD::ChargeR::process(ChargeR *this)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  SnapshotManager *this_00;
  Snapshot *pSVar4;
  reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  reference ppSVar8;
  AtomType *AT;
  long *in_RDI;
  double dVar9;
  RealType RVar10;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  Atom *atom;
  RealType q;
  uint k;
  RealType binC;
  uint i_1;
  int binNo;
  RealType distance;
  Vector3d pos;
  uint i;
  int istep;
  int nFrames;
  DumpReader reader;
  int ii;
  StuntDouble *sd;
  DumpReader *in_stack_ffffffffffffec70;
  StuntDouble *in_stack_ffffffffffffec78;
  undefined7 in_stack_ffffffffffffec80;
  undefined1 in_stack_ffffffffffffec87;
  SelectionEvaluator *in_stack_ffffffffffffeca8;
  int in_stack_ffffffffffffecfc;
  FixedChargeAdapter in_stack_ffffffffffffed00;
  double local_12e8;
  uint local_12dc;
  DumpReader *local_12d8;
  uint local_12d0;
  uint local_128c;
  int local_1288;
  string *in_stack_ffffffffffffeec0;
  SimInfo *in_stack_ffffffffffffeec8;
  DumpReader *in_stack_ffffffffffffeed0;
  SelectionEvaluator *local_10;
  
  DumpReader::DumpReader
            (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0);
  iVar3 = DumpReader::getNFrames(in_stack_ffffffffffffec70);
  *(int *)(in_RDI + 0x1a) = iVar3 / (int)in_RDI[6];
  for (local_1288 = 0; local_1288 < iVar3; local_1288 = (int)in_RDI[6] + local_1288) {
    DumpReader::readFrame((DumpReader *)in_stack_ffffffffffffed00.at_,in_stack_ffffffffffffecfc);
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar4 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI[0x19] = (long)pSVar4;
    for (local_128c = 0; local_128c < *(uint *)((long)in_RDI + 0x34); local_128c = local_128c + 1) {
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    *)(in_RDI + 0xe5),(ulong)local_128c);
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::clear
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1fd354);
    }
    bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
    if (bVar2) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffeca8);
      SelectionManager::setSelectionSet
                ((SelectionManager *)CONCAT17(in_stack_ffffffffffffec87,in_stack_ffffffffffffec80),
                 (SelectionSet *)in_stack_ffffffffffffec78);
      SelectionSet::~SelectionSet((SelectionSet *)0x1fd3eb);
    }
    local_10 = (SelectionEvaluator *)
               SelectionManager::beginSelected
                         ((SelectionManager *)
                          CONCAT17(in_stack_ffffffffffffec87,in_stack_ffffffffffffec80),
                          (int *)in_stack_ffffffffffffec78);
    while (local_10 != (SelectionEvaluator *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffec78);
      dVar9 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1fd473);
      if (dVar9 < (double)in_RDI[0xe3]) {
        dVar1 = (double)in_RDI[0xe4];
        std::
        vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
        ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                      *)(in_RDI + 0xe5),(long)(int)(dVar9 / dVar1));
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                  ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                   CONCAT17(in_stack_ffffffffffffec87,in_stack_ffffffffffffec80),
                   (value_type *)in_stack_ffffffffffffec78);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe8),
                            (long)(int)(dVar9 / dVar1));
        *pvVar5 = *pvVar5 + 1.0;
      }
      in_stack_ffffffffffffeca8 =
           (SelectionEvaluator *)
           SelectionManager::nextSelected
                     ((SelectionManager *)
                      CONCAT17(in_stack_ffffffffffffec87,in_stack_ffffffffffffec80),
                      (int *)in_stack_ffffffffffffec78);
      local_10 = in_stack_ffffffffffffeca8;
    }
    for (local_12d0 = 0; local_12d0 < *(uint *)((long)in_RDI + 0x34); local_12d0 = local_12d0 + 1) {
      local_12d8 = (DumpReader *)0x0;
      local_12dc = 0;
      while( true ) {
        pvVar6 = std::
                 vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               *)(in_RDI + 0xe5),(ulong)local_12d0);
        sVar7 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                          (pvVar6);
        if (sVar7 <= local_12dc) break;
        local_12e8 = 0.0;
        pvVar6 = std::
                 vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               *)(in_RDI + 0xe5),(ulong)local_12d0);
        ppSVar8 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[](pvVar6,(ulong)local_12dc);
        AT = Atom::getAtomType((Atom *)*ppSVar8);
        pvVar6 = std::
                 vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               *)(in_RDI + 0xe5),(ulong)local_12d0);
        ppSVar8 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[](pvVar6,(ulong)local_12dc);
        bVar2 = StuntDouble::isAtom(*ppSVar8);
        if (bVar2) {
          FixedChargeAdapter::FixedChargeAdapter((FixedChargeAdapter *)&stack0xffffffffffffed00,AT);
          bVar2 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1fd691);
          if (bVar2) {
            RVar10 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffec70);
            local_12e8 = RVar10 + 0.0;
          }
          FluctuatingChargeAdapter::FluctuatingChargeAdapter
                    ((FluctuatingChargeAdapter *)&stack0xffffffffffffecf8,AT);
          in_stack_ffffffffffffec87 =
               FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x1fd6f2);
          if ((bool)in_stack_ffffffffffffec87) {
            in_stack_ffffffffffffec78 =
                 (StuntDouble *)StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffec70);
            local_12e8 = (double)in_stack_ffffffffffffec78 + local_12e8;
          }
        }
        local_12d8 = (DumpReader *)(local_12e8 + (double)local_12d8);
        local_12dc = local_12dc + 1;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xee),
                          (ulong)local_12d0);
      *pvVar5 = (double)local_12d8 + *pvVar5;
      in_stack_ffffffffffffec70 = local_12d8;
    }
  }
  (**(code **)(*in_RDI + 0x20))();
  DumpReader::~DumpReader(in_stack_ffffffffffffec70);
  return;
}

Assistant:

void ChargeR::process() {
    StuntDouble* sd;
    int ii;

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos      = sd->getPos();
        RealType distance = pos.length();

        if (distance < len_) {
          int binNo = int(distance / deltaR_);
          sliceSDLists_[binNo].push_back(sd);
          sliceSDCount_[binNo]++;
        }
      }

      // loop over the slices to calculate the charge
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binC = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][k]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][k]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) { q += fca.getCharge(); }

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
          }

          binC += q;
        }
        chargeR_[i] += binC;
        // Units of (e / Ang^2 / fs)
      }
    }

    writeChargeR();
  }